

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void SerializeMany<ParamsStream<HashWriter&,TransactionSerParams>,COutPoint,CScript,unsigned_int>
               (ParamsStream<HashWriter_&,_TransactionSerParams> *s,COutPoint *args,CScript *args_1,
               uint *args_2)

{
  long in_FS_OFFSET;
  uint local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  COutPoint::
  SerializationOps<ParamsStream<HashWriter&,TransactionSerParams>,COutPoint_const,ActionSerialize>
            (args,s);
  SerializeMany<ParamsStream<HashWriter&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            (s,&args_1->super_CScriptBase);
  local_24 = *args_2;
  CSHA256::Write(&s->m_substream->ctx,(uchar *)&local_24,4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}